

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::~session_base_t(session_base_t *this)

{
  hello_msg_session_t *this_00;
  
  this_00 = (hello_msg_session_t *)(this[-1].super_own_t.options.routing_id + 0x57);
  hello_msg_session_t::~hello_msg_session_t(this_00);
  operator_delete(this_00,0x5f8);
  return;
}

Assistant:

zmq::session_base_t::~session_base_t ()
{
    zmq_assert (!_pipe);
    zmq_assert (!_zap_pipe);

    //  If there's still a pending linger timer, remove it.
    if (_has_linger_timer) {
        cancel_timer (linger_timer_id);
        _has_linger_timer = false;
    }

    //  Close the engine.
    if (_engine)
        _engine->terminate ();

    LIBZMQ_DELETE (_addr);
}